

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedBrokerServer.cpp
# Opt level: O3

void helics::apps::TypedBrokerServer::assignPort
               (portData *pd,int pnumber,shared_ptr<helics::Broker> *brk)

{
  pointer ptVar1;
  
  ptVar1 = (pd->
           super__Vector_base<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ptVar1 == (pd->
                  super__Vector_base<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>,_std::allocator<std::tuple<int,_bool,_std::shared_ptr<helics::Broker>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    if (*(int *)&(ptVar1->super__Tuple_impl<0UL,_int,_bool,_std::shared_ptr<helics::Broker>_>).
                 super__Tuple_impl<1UL,_bool,_std::shared_ptr<helics::Broker>_>.field_0x14 ==
        pnumber) break;
    ptVar1 = ptVar1 + 1;
  }
  (ptVar1->super__Tuple_impl<0UL,_int,_bool,_std::shared_ptr<helics::Broker>_>).
  super__Tuple_impl<1UL,_bool,_std::shared_ptr<helics::Broker>_>.super__Head_base<1UL,_bool,_false>.
  _M_head_impl = true;
  (ptVar1->super__Tuple_impl<0UL,_int,_bool,_std::shared_ptr<helics::Broker>_>).
  super__Tuple_impl<1UL,_bool,_std::shared_ptr<helics::Broker>_>.
  super__Tuple_impl<2UL,_std::shared_ptr<helics::Broker>_>.
  super__Head_base<2UL,_std::shared_ptr<helics::Broker>,_false>._M_head_impl.
  super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (brk->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(ptVar1->super__Tuple_impl<0UL,_int,_bool,_std::shared_ptr<helics::Broker>_>).
              super__Tuple_impl<1UL,_bool,_std::shared_ptr<helics::Broker>_>.
              super__Tuple_impl<2UL,_std::shared_ptr<helics::Broker>_>.
              super__Head_base<2UL,_std::shared_ptr<helics::Broker>,_false>._M_head_impl.
              super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(brk->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  return;
}

Assistant:

void TypedBrokerServer::assignPort(portData& pd, int pnumber, std::shared_ptr<Broker>& brk)
{
    for (auto& pdi : pd) {
        if (std::get<0>(pdi) == pnumber) {
            std::get<1>(pdi) = true;
            std::get<2>(pdi) = brk;
            break;
        }
    }
}